

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_getchar.c
# Opt level: O0

int mpt_parse_getchar(mpt_parser_input *src,mpt_path *path)

{
  int iVar1;
  int curr;
  mpt_path *path_local;
  mpt_parser_input *src_local;
  
  if (src->line == 0) {
    src->line = src->line + 1;
  }
  src_local._4_4_ = (*src->getc)(src->arg);
  if (0 < src_local._4_4_) {
    if (src_local._4_4_ == 10) {
      src->line = src->line + 1;
    }
    if ((path != (mpt_path *)0x0) && (iVar1 = mpt_path_addchar(path,src_local._4_4_), iVar1 < 0)) {
      src_local._4_4_ = -1;
    }
  }
  return src_local._4_4_;
}

Assistant:

extern int mpt_parse_getchar(MPT_STRUCT(parser_input) *src, MPT_STRUCT(path) *path)
{
	int curr;
	
	if (!src->line) ++src->line;
	
	if ((curr = src->getc(src->arg)) <= 0) {
		return curr;
	}
	if (curr == '\n') {
		src->line++;
	}
	if (path && mpt_path_addchar(path, curr) < 0) {
		return -1;
	}
	return curr;
}